

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O2

char_t __thiscall
cfgfile::input_stream_t<cfgfile::qstring_trait_t>::get
          (input_stream_t<cfgfile::qstring_trait_t> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  _Elt_pointer pQVar4;
  QChar *pQVar5;
  size_t sVar6;
  char_t ch;
  char_t local_2a;
  position_t local_28;
  
  bVar3 = at_end(this);
  if (bVar3) {
    local_2a.ucs = L'\0';
  }
  else {
    uVar1 = this->m_line_number;
    uVar2 = this->m_column_number;
    local_28.m_line_number._0_4_ = (int)uVar1;
    local_28.m_column_number = uVar2;
    local_28.m_line_number._4_4_ = (int)((ulong)uVar1 >> 0x20);
    std::
    deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
    ::emplace_back<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>
              (&(this->m_prev_positions).c,&local_28);
    this->m_column_number = this->m_column_number + 1;
    local_2a.ucs = L'\0';
    pQVar4 = (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pQVar4 == (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl
                  .super__Deque_impl_data._M_start._M_cur) {
      sVar6 = this->m_buf_pos;
      if (sVar6 == 0x200) {
        qstring_trait_t::fill_buf
                  (this->m_stream,&this->m_buf,0x200,&this->m_stream_pos,this->m_stream_size);
        this->m_buf_pos = 0;
        sVar6 = 0;
      }
      pQVar5 = QString::data(&this->m_buf);
      local_2a.ucs = pQVar5[sVar6].ucs;
      this->m_buf_pos = this->m_buf_pos + 1;
    }
    else {
      if (pQVar4 == (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pQVar4 = (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x100;
      }
      local_2a.ucs = pQVar4[-1].ucs;
      std::deque<QChar,_std::allocator<QChar>_>::pop_back(&(this->m_returned_char).c);
    }
    bVar3 = is_new_line(this,&local_2a);
    if (bVar3) {
      this->m_line_number = this->m_line_number + 1;
      this->m_column_number = 1;
    }
  }
  return (char_t)local_2a.ucs;
}

Assistant:

typename Trait::char_t get()
	{
		if( !at_end() )
		{
			m_prev_positions.push( { m_column_number, m_line_number } );

			m_column_number += 1;

			typename Trait::char_t ch( 0x00 );

			if( !m_returned_char.empty() )
			{
				ch = m_returned_char.top();

				m_returned_char.pop();

				if( is_new_line( ch ) )
				{
					m_line_number += 1;
					m_column_number = 1;
				}

				return ch;
			}

			if( m_buf_pos == c_buff_size )
			{
				Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
				m_buf_pos = 0;
			}

			ch = m_buf[ m_buf_pos ];

			++m_buf_pos;

			if( is_new_line( ch ) )
			{
				m_line_number += 1;
				m_column_number = 1;
			}

			return ch;
		}
		else
			return typename Trait::char_t( 0x00 );
	}